

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *pFVar10;
  void *pvVar11;
  xmlTextReaderPtr reader;
  undefined4 uVar12;
  undefined1 *puVar13;
  uint uVar14;
  char *pcVar15;
  void *ctx;
  int in_R9D;
  ulong uVar16;
  bool bVar17;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  int iStack_19c8;
  glob64_t gStack_19b0;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  short sStack_1960;
  char acStack_1768 [499];
  undefined1 uStack_1575;
  char acStack_1568 [499];
  undefined1 uStack_1375;
  char acStack_1368 [499];
  undefined1 uStack_1175;
  char *pcStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  char *pcStack_1158;
  ulong uStack_1150;
  code *pcStack_1148;
  long lStack_1140;
  char *pcStack_1138;
  long lStack_1130;
  undefined4 uStack_1124;
  char *pcStack_1120;
  glob64_t gStack_1118;
  char acStack_10d0 [499];
  undefined1 uStack_edd;
  undefined1 auStack_ed0 [512];
  char acStack_cd0 [499];
  undefined1 uStack_add;
  char acStack_ad0 [499];
  undefined1 uStack_8dd;
  char *pcStack_8d8;
  ulong uStack_8d0;
  undefined8 uStack_8c8;
  char *pcStack_8c0;
  long lStack_8b8;
  code *pcStack_8b0;
  ulong local_8a0;
  char *local_898;
  long local_890;
  long local_888;
  int local_87c;
  char *local_878;
  glob64_t local_870;
  undefined1 local_828 [512];
  char local_628 [499];
  undefined1 local_435;
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcStack_8b0 = (code *)0x107c16;
  local_87c = options;
  pcVar4 = baseFilename(filename);
  pcStack_8b0 = (code *)0x107c26;
  local_898 = filename;
  uVar5 = xmlSchemaNewParserCtxt(filename);
  pcStack_8b0 = (code *)0x107c3e;
  xmlSchemaSetParserErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
  pcStack_8b0 = (code *)0x107c46;
  lVar6 = xmlSchemaParse(uVar5);
  pcStack_8b0 = (code *)0x107c51;
  xmlSchemaFreeParserCtxt(uVar5);
  pcStack_8b0 = (code *)0x107c59;
  sVar7 = strlen(pcVar4);
  iVar2 = (int)sVar7;
  if (iVar2 - 500U < 0xfffffe11) {
    pcStack_8b0 = (code *)0x107c6f;
    xmlSchemaFree(lVar6);
    iVar2 = -1;
  }
  else {
    iVar3 = iVar2 + -6;
    if (pcVar4[(long)iVar2 + -6] != '_') {
      iVar3 = iVar2 + -4;
    }
    if (pcVar4[(long)iVar3 + -2] == '_') {
      iVar3 = iVar3 + -2;
    }
    sVar7 = (size_t)iVar3;
    pcStack_8b0 = (code *)0x107cb8;
    local_890 = lVar6;
    memcpy(local_828,pcVar4,sVar7);
    local_828[sVar7] = 0;
    pcStack_8b0 = (code *)0x107cdf;
    iVar2 = snprintf(local_228,499,"./test/schemas/%s_?.xml",local_828);
    if (0x1f2 < iVar2) {
      local_35 = 0;
    }
    if (pcVar4[sVar7] == '_') {
      pcStack_8b0 = (code *)0x107d09;
      memcpy(local_828,pcVar4,sVar7 + 2);
      local_828[sVar7 + 2] = 0;
    }
    local_870.gl_offs = 0;
    local_8a0 = 0;
    pcStack_8b0 = (code *)0x107d3f;
    glob64(local_228,8,(__errfunc *)0x0,&local_870);
    lVar6 = local_890;
    if (local_870.gl_pathc != 0) {
      uVar16 = 0;
      local_8a0 = 0;
      do {
        testErrorsSize = 0;
        testErrors[0] = '\0';
        pcVar4 = local_870.gl_pathv[uVar16];
        pcStack_8b0 = (code *)0x107d82;
        pcVar8 = baseFilename(pcVar4);
        pcStack_8b0 = (code *)0x107d8d;
        sVar7 = strlen(pcVar8);
        iVar2 = (int)sVar7;
        if ((iVar2 < 7) || (pcVar8[iVar2 - 6] != '_')) {
          pcStack_8b0 = (code *)0x107fcf;
          fprintf(_stderr,"don\'t know how to process %s\n",pcVar4);
        }
        else {
          uVar14 = (uint)pcVar8[iVar2 - 5];
          pcStack_8b0 = (code *)0x107dd5;
          iVar2 = snprintf(local_628,499,"result/schemas/%s_%c",local_828,(ulong)uVar14);
          if (0x1f2 < iVar2) {
            local_435 = 0;
          }
          puVar13 = local_828;
          pcStack_8b0 = (code *)0x107e0a;
          iVar2 = snprintf(local_428,499,"result/schemas/%s_%c.err",puVar13,(ulong)uVar14);
          uVar12 = SUB84(puVar13,0);
          if (0x1f2 < iVar2) {
            local_235 = 0;
          }
          if (lVar6 != 0) {
            nb_tests = nb_tests + 1;
            pcStack_8b0 = (code *)0x107e36;
            local_888 = xmlReadFile(pcVar4,0,local_87c);
            if (local_888 == 0) {
              pcStack_8b0 = (code *)0x107ff1;
              fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar4,local_898);
              local_8a0 = 0xffffffff;
            }
            else {
              pcVar15 = local_628;
              pcStack_8b0 = (code *)0x107e5f;
              pcVar9 = resultFilename(pcVar15,temp_directory,".res");
              if (pcVar9 == (char *)0x0) {
                pcStack_8b0 = rngTest;
                schemasTest_cold_2();
                uStack_8c8 = 0xfffffffa;
                pcStack_1148 = (code *)0x10808e;
                uStack_1124 = uVar12;
                pcStack_8d8 = pcVar4;
                uStack_8d0 = uVar16;
                pcStack_8c0 = pcVar8;
                lStack_8b8 = lVar6;
                pcStack_8b0 = (code *)(ulong)uVar14;
                pcVar4 = baseFilename(pcVar15);
                pcStack_1148 = (code *)0x10809e;
                pcStack_1138 = pcVar15;
                uVar5 = xmlRelaxNGNewParserCtxt(pcVar15);
                pcStack_1148 = (code *)0x1080b6;
                xmlRelaxNGSetParserErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
                pcStack_1148 = (code *)0x1080be;
                lVar6 = xmlRelaxNGParse(uVar5);
                pcStack_1148 = (code *)0x1080c9;
                xmlRelaxNGFreeParserCtxt(uVar5);
                pcStack_1148 = (code *)0x1080d1;
                sVar7 = strlen(pcVar4);
                if ((int)sVar7 - 500U < 0xfffffe11) {
                  pcStack_1148 = (code *)0x1080e8;
                  xmlRelaxNGFree(lVar6);
                  return -1;
                }
                uVar16 = (ulong)((int)sVar7 - 4);
                pcStack_1148 = (code *)0x10810d;
                memcpy(auStack_ed0,pcVar4,uVar16);
                auStack_ed0[uVar16] = 0;
                pcStack_1148 = (code *)0x108134;
                iVar2 = snprintf(acStack_ad0,499,"./test/relaxng/%s_?.xml",auStack_ed0);
                if (0x1f2 < iVar2) {
                  uStack_8dd = 0;
                }
                gStack_1118.gl_offs = 0;
                pcStack_1148 = (code *)0x108167;
                glob64(acStack_ad0,8,(__errfunc *)0x0,&gStack_1118);
                uVar5 = 0;
                if (gStack_1118.gl_pathc == 0) goto LAB_0010844c;
                uVar16 = 0;
                uVar5 = 0;
                lStack_1140 = lVar6;
                goto LAB_00108181;
              }
              pcStack_8b0 = (code *)0x107e7a;
              pFVar10 = fopen64(pcVar9,"wb");
              if (pFVar10 == (FILE *)0x0) {
                pcStack_8b0 = (code *)0x108005;
                schemasTest_cold_1();
                local_8a0 = 0xffffffff;
              }
              else {
                pcStack_8b0 = (code *)0x107e8e;
                uVar5 = xmlSchemaNewValidCtxt(lVar6);
                pcStack_8b0 = (code *)0x107ea6;
                xmlSchemaSetValidErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
                pcStack_8b0 = (code *)0x107eb3;
                iVar2 = xmlSchemaValidateDoc(uVar5,local_888);
                pcVar8 = "%s validation generated an internal error\n";
                if (0 < iVar2) {
                  pcVar8 = "%s fails to validate\n";
                }
                if (iVar2 == 0) {
                  pcVar8 = "%s validates\n";
                }
                pcStack_8b0 = (code *)0x107ee9;
                local_878 = pcVar4;
                fprintf(pFVar10,pcVar8);
                pcStack_8b0 = (code *)0x107ef1;
                fclose(pFVar10);
                pcStack_8b0 = (code *)0x107f01;
                iVar3 = compareFiles(pcVar9,local_628);
                bVar17 = iVar3 != 0;
                if (bVar17) {
                  pcStack_8b0 = (code *)0x108039;
                  fprintf(_stderr,"Result for %s on %s failed\n",local_878,local_898);
                }
                pcStack_8b0 = (code *)0x107f11;
                unlink(pcVar9);
                pcStack_8b0 = (code *)0x107f19;
                free(pcVar9);
                lVar6 = local_890;
                if (iVar2 != 0) {
                  pcStack_8b0 = (code *)0x107f38;
                  iVar2 = compareFileMem(local_428,testErrors,testErrorsSize);
                  lVar6 = local_890;
                  if (iVar2 != 0) {
                    pcStack_8b0 = (code *)0x107f69;
                    fprintf(_stderr,"Error for %s on %s failed\n",local_878,local_898);
                    bVar17 = true;
                  }
                }
                pcStack_8b0 = (code *)0x107f83;
                xmlSchemaFreeValidCtxt(uVar5);
                pcStack_8b0 = (code *)0x107f8d;
                xmlFreeDoc(local_888);
                local_8a0 = local_8a0 & 0xffffffff;
                if (bVar17) {
                  local_8a0 = 1;
                }
              }
            }
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < local_870.gl_pathc);
    }
    pcStack_8b0 = (code *)0x10804d;
    globfree64(&local_870);
    pcStack_8b0 = (code *)0x108055;
    xmlSchemaFree(lVar6);
    iVar2 = (int)local_8a0;
  }
  return iVar2;
LAB_00108181:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcVar4 = gStack_1118.gl_pathv[uVar16];
  pcStack_1148 = (code *)0x1081a3;
  pcVar8 = baseFilename(pcVar4);
  pcStack_1148 = (code *)0x1081ae;
  sVar7 = strlen(pcVar8);
  iVar2 = (int)sVar7;
  if ((iVar2 < 7) || (pcVar8[iVar2 - 6] != '_')) {
    pcStack_1148 = (code *)0x1083a6;
    fprintf(_stderr,"don\'t know how to process %s\n",pcVar4);
  }
  else {
    uVar14 = (uint)pcVar8[iVar2 - 5];
    pcStack_1148 = (code *)0x1081f6;
    iVar2 = snprintf(acStack_10d0,499,"result/relaxng/%s_%c",auStack_ed0,(ulong)uVar14);
    if (0x1f2 < iVar2) {
      uStack_edd = 0;
    }
    puVar13 = auStack_ed0;
    pcStack_1148 = (code *)0x10822b;
    iVar2 = snprintf(acStack_cd0,499,"result/relaxng/%s_%c.err",puVar13,(ulong)uVar14);
    uVar12 = SUB84(puVar13,0);
    if (0x1f2 < iVar2) {
      uStack_add = 0;
    }
    if (lVar6 != 0) {
      nb_tests = nb_tests + 1;
      pcStack_1148 = (code *)0x108257;
      lStack_1130 = xmlReadFile(pcVar4,0,uStack_1124);
      if (lStack_1130 == 0) {
        pcStack_1148 = (code *)0x1083c8;
        fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar4,pcStack_1138);
      }
      else {
        pcVar15 = acStack_10d0;
        pcStack_1148 = (code *)0x108280;
        pcVar9 = resultFilename(pcVar15,temp_directory,".res");
        if (pcVar9 == (char *)0x0) {
          pcStack_1148 = rngStreamTest;
          rngTest_cold_2();
          pcStack_1170 = pcVar4;
          uStack_1168 = uVar5;
          uStack_1160 = uVar5;
          pcStack_1158 = pcVar8;
          uStack_1150 = uVar16;
          pcStack_1148 = (code *)(ulong)uVar14;
          pcVar4 = baseFilename(pcVar15);
          sVar7 = strlen(pcVar4);
          if ((int)sVar7 - 500U < 0xfffffe11) {
            fprintf(_stderr,"len(base) == %d !\n",sVar7 & 0xffffffff);
            return -1;
          }
          uVar16 = (ulong)((int)sVar7 - 4);
          memcpy(&uStack_1968,pcVar4,uVar16);
          *(undefined1 *)((long)&uStack_1968 + uVar16) = 0;
          if (((sStack_1960 == 0x31 && CONCAT44(uStack_1964,uStack_1968) == 0x5f3031726f747574) ||
              (sStack_1960 == 0x32 && CONCAT44(uStack_1964,uStack_1968) == 0x5f3031726f747574)) ||
             ((char)sStack_1960 == '\0' && CONCAT44(uStack_1964,uStack_1968) == 0x325f33726f747574))
          {
LAB_00108553:
            bVar17 = true;
          }
          else {
            if ((CONCAT31((undefined3)uStack_1964,uStack_1968._3_1_) == 0x373733 &&
                 uStack_1968 == 0x33373033) ||
               ((char)sStack_1960 == '\0' && CONCAT44(uStack_1964,uStack_1968) == 0x325f38726f747574
               )) goto LAB_00108553;
            bVar17 = false;
          }
          iStack_19c8 = 0;
          iVar2 = snprintf(acStack_1568,499,"./test/relaxng/%s_?.xml",&uStack_1968);
          if (0x1f2 < iVar2) {
            uStack_1375 = 0;
          }
          gStack_19b0.gl_offs = 0;
          glob64(acStack_1568,8,(__errfunc *)0x0,&gStack_19b0);
          if (gStack_19b0.gl_pathc == 0) goto LAB_0010873b;
          uVar16 = 0;
          iStack_19c8 = 0;
          goto LAB_001085de;
        }
        pcStack_1148 = (code *)0x10829b;
        pFVar10 = fopen64(pcVar9,"wb");
        if (pFVar10 != (FILE *)0x0) {
          pcStack_1148 = (code *)0x1082b0;
          pvVar11 = (void *)xmlRelaxNGNewValidCtxt(lStack_1140);
          pcStack_1148 = (code *)0x1082c8;
          xmlRelaxNGSetValidErrors(pvVar11,testErrorHandler,testErrorHandler,pvVar11);
          pcStack_1148 = (code *)0x1082d5;
          ctx = pvVar11;
          iVar2 = xmlRelaxNGValidateDoc(pvVar11,lStack_1130);
          pcVar8 = "%s validation generated an internal error\n";
          if (0 < iVar2) {
            pcVar8 = "%s fails to validate\n";
          }
          if (iVar2 == 0) {
            pcVar8 = "%s validates\n";
          }
          pcStack_1148 = (code *)0x108305;
          pcStack_1120 = pcVar4;
          testErrorHandler(ctx,pcVar8);
          pcStack_1148 = (code *)0x10830d;
          fclose(pFVar10);
          pcStack_1148 = (code *)0x10831a;
          iVar2 = compareFiles(pcVar9,acStack_10d0);
          if (iVar2 != 0) {
            pcStack_1148 = (code *)0x108401;
            fprintf(_stderr,"Result for %s on %s failed\n",pcStack_1120,pcStack_1138);
          }
          pcStack_1148 = (code *)0x10832a;
          unlink(pcVar9);
          pcStack_1148 = (code *)0x108332;
          free(pcVar9);
          pcStack_1148 = (code *)0x10834c;
          iVar3 = compareFileMem(acStack_cd0,testErrors,testErrorsSize);
          if (iVar3 != 0) {
            pcStack_1148 = (code *)0x10842d;
            fprintf(_stderr,"Error for %s on %s failed\n",pcStack_1120,pcStack_1138);
            pcStack_1148 = (code *)0x108442;
            printf("%s",testErrors);
          }
          pcStack_1148 = (code *)0x10835f;
          xmlRelaxNGFreeValidCtxt(pvVar11);
          pcStack_1148 = (code *)0x108369;
          xmlFreeDoc(lStack_1130);
          lVar6 = lStack_1140;
          if (iVar3 != 0 || iVar2 != 0) {
            uVar5 = 1;
          }
          goto LAB_00108378;
        }
        pcStack_1148 = (code *)0x1083d7;
        rngTest_cold_1();
      }
      uVar5 = 0xffffffff;
      lVar6 = lStack_1140;
    }
  }
LAB_00108378:
  uVar16 = uVar16 + 1;
  if (gStack_1118.gl_pathc <= uVar16) {
LAB_0010844c:
    pcStack_1148 = (code *)0x108456;
    globfree64(&gStack_1118);
    pcStack_1148 = (code *)0x10845e;
    xmlRelaxNGFree(lVar6);
    return (int)uVar5;
  }
  goto LAB_00108181;
LAB_001085de:
  testErrorsSize = 0;
  testErrors[0] = '\0';
  pcVar4 = gStack_19b0.gl_pathv[uVar16];
  pcVar8 = baseFilename(pcVar4);
  sVar7 = strlen(pcVar8);
  iVar2 = (int)sVar7;
  if ((iVar2 < 7) || (pcVar8[iVar2 - 6] != '_')) {
    pcVar8 = "don\'t know how to process %s\n";
LAB_00108725:
    fprintf(_stderr,pcVar8,pcVar4);
  }
  else {
    cVar1 = pcVar8[iVar2 - 5];
    iVar2 = snprintf(acStack_1368,499,"result/relaxng/%s_%c",&uStack_1968,(ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar2) {
      uStack_1175 = 0;
    }
    iVar2 = snprintf(acStack_1768,499,"result/relaxng/%s_%c.err",&uStack_1968,
                     (ulong)(uint)(int)cVar1);
    if (0x1f2 < iVar2) {
      uStack_1575 = 0;
    }
    reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar4,0,uVar12);
    if (reader == (xmlTextReaderPtr)0x0) {
      fprintf(_stderr,"Failed to build reader for %s\n",pcVar4);
    }
    if (bVar17) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = acStack_1768;
    }
    iVar2 = streamProcessTest(pcVar4,acStack_1368,pcVar8,reader,pcVar15,in_R9D);
    xmlFreeTextReader(reader);
    if (iVar2 != 0) {
      iStack_19c8 = -1;
      pcVar8 = "instance %s failed\n";
      goto LAB_00108725;
    }
  }
  uVar16 = uVar16 + 1;
  if (gStack_19b0.gl_pathc <= uVar16) {
LAB_0010873b:
    globfree64(&gStack_19b0);
    return iStack_19c8;
  }
  goto LAB_001085de;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas == NULL) {
	} else {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, err,
	                         options, schemas);
	    if (ret != 0)
		res = ret;
	}
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}